

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall
CProficiencies::TrainProficiency
          (CProficiencies *this,char_data *ch,char_data *trainer,char *argument)

{
  short *psVar1;
  int iVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  char *pcVar6;
  CProficiencies *pCVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string_view fmt_00;
  allocator<char> local_137a;
  allocator<char> local_1379;
  char_data *ch_local;
  int local_136c;
  uint local_1368;
  int local_1364;
  char *local_1360;
  CQueue *local_1358;
  proficiency_msg *local_1350;
  ulong local_1348;
  char_data *trainer_local;
  proficiency_msg messages;
  string local_1308;
  string message;
  string local_12b8;
  string buffer;
  string local_1278;
  string local_1258;
  char arg1 [4608];
  
  ch_local = ch;
  trainer_local = trainer;
  if (ch == (char_data *)0x0) {
    fmt_00._M_str = "CProficiencies::TrainProficiency: Charater is null.";
    fmt_00._M_len = 0x33;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt_00);
    return;
  }
  if (trainer == (char_data *)0x0) {
    send_to_char("Invalid trainer",ch);
    return;
  }
  pcVar6 = one_argument(argument,arg1);
  bVar3 = str_cmp(arg1,"train");
  if (bVar3) {
    pcVar6 = "Syntax: proficiencies train <proficiency>\n\r";
    goto LAB_003b2053;
  }
  uVar4 = ProfIndexLookup(pcVar6);
  lVar9 = 0;
  do {
    if (lVar9 == 4) {
      pcVar6 = "You can\'t study that here.\n\r";
      goto LAB_003b2053;
    }
    psVar1 = trainer->pIndexData->profs_taught + lVar9;
    lVar9 = lVar9 + 1;
  } while (*psVar1 != uVar4);
  if (ch->pcdata == (PC_DATA *)0x0) {
    pCVar7 = &prof_none;
  }
  else {
    pCVar7 = &ch->pcdata->profs;
  }
  if ((uVar4 < 0x19) && (0 < pCVar7->profs[(uint)(int)(short)uVar4])) {
    pcVar6 = "You are already familiar with that proficiency.\n\r";
    goto LAB_003b2053;
  }
  iVar10 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
           _M_impl.super__Vector_impl_data._M_start[(short)uVar4].cost;
  if (pCVar7->points < iVar10) {
    pcVar6 = "You don\'t have enough points to study that proficiency.\n\r";
    goto LAB_003b2053;
  }
  local_1360 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_start[(short)uVar4].name;
  iVar2 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl
          .super__Vector_impl_data._M_start[(short)uVar4].minlevel;
  uVar5 = ProfIndexLookup(prof_table.
                          super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                          _M_impl.super__Vector_impl_data._M_start[(short)uVar4].requires);
  if (uVar5 == 0xffff) {
LAB_003b2038:
    if (iVar2 <= ch->level) {
      local_136c = iVar10;
      local_1368 = (int)(short)uVar4;
      act("You ask $N to teach you about $t.",ch,local_1360,trainer,3);
      local_1350 = prof_msg_table + (short)uVar4;
      messages.learning_msgs[4] = prof_msg_table[(short)uVar4].learning_msgs[4];
      messages.learning_msgs[2] = prof_msg_table[(short)uVar4].learning_msgs[2];
      messages.learning_msgs[3] = prof_msg_table[(short)uVar4].learning_msgs[3];
      messages.learning_msgs[0] = prof_msg_table[(short)uVar4].learning_msgs[0];
      messages.learning_msgs[1] = prof_msg_table[(short)uVar4].learning_msgs[1];
      iVar10 = 2;
      local_1358 = &RS.Queue;
      for (uVar8 = 0; (uVar8 < 5 && (messages.learning_msgs[uVar8] != (char *)0x0));
          uVar8 = uVar8 + 1) {
        if ((uVar8 == 4) || (messages.learning_msgs[uVar8 + 1] == (char *)0x0)) {
          local_1348 = uVar8;
          pcVar6 = get_char_color(ch_local,"yellow");
          END_COLOR(ch_local);
          message.field_2._M_allocated_capacity = (size_type)local_1360;
          fmt.size_ = 0xccc;
          fmt.data_ = (char *)0x23;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&message;
          message._M_dataplus._M_p = pcVar6;
          ::fmt::v9::vformat_abi_cxx11_
                    (&buffer,(v9 *)"{}You are now proficient at {}.{}\n\r",fmt,args);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1308,"TrainProficiency",(allocator<char> *)&message);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1258,"send_to_char_queue",(allocator<char> *)&local_1364);
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
                    (local_1358,iVar10,&local_1308,&local_1258,send_to_char_queue,&buffer,&ch_local)
          ;
          std::__cxx11::string::~string((string *)&local_1258);
          std::__cxx11::string::~string((string *)&local_1308);
          std::__cxx11::string::~string((string *)&buffer);
          uVar8 = local_1348;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&message,local_1350->learning_msgs[uVar8],(allocator<char> *)&buffer);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12b8,"TrainProficiency",&local_1379);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1278,"act_queue",&local_137a);
        buffer._M_dataplus._M_p = (pointer)0x0;
        local_1364 = 3;
        in_R9.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&message;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),std::__cxx11::string&,char_data*&,decltype(nullptr),char_data*&,int>
                  (local_1358,iVar10,&local_12b8,&local_1278,act_queue,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&message,
                   &ch_local,(void **)&buffer,&trainer_local,&local_1364);
        std::__cxx11::string::~string((string *)&local_1278);
        std::__cxx11::string::~string((string *)&local_12b8);
        std::__cxx11::string::~string((string *)&message);
        iVar10 = iVar10 + 2;
      }
      if (ch_local->pcdata == (PC_DATA *)0x0) {
        pCVar7 = &prof_none;
      }
      else {
        pCVar7 = &ch_local->pcdata->profs;
      }
      pCVar7->points = pCVar7->points - local_136c;
      SetProf(pCVar7,local_1368,1);
      WAIT_STATE(ch_local,iVar10);
      return;
    }
    pcVar6 = "You are not advanced enough in your guild to learn that proficiency.\n\r";
  }
  else {
    if (uVar5 < 0x19) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar7 = &prof_none;
      }
      else {
        pCVar7 = &ch->pcdata->profs;
      }
      if (-1 < pCVar7->profs[uVar5]) goto LAB_003b2038;
    }
    pcVar6 = "That proficiency requires understanding of a proficiency you do not possess.\n\r";
  }
LAB_003b2053:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void CProficiencies::TrainProficiency(char_data* ch, char_data* trainer, char* argument)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("CProficiencies::TrainProficiency: Charater is null.");
		return;
	}
	
	if (trainer == nullptr)
	{
		send_to_char("Invalid trainer", ch);
		return;
	}

	char arg1[MSL];
	argument = one_argument(argument, arg1);

	if (str_cmp(arg1, "train"))
	{
		send_to_char("Syntax: proficiencies train <proficiency>\n\r", ch);
		return;
	}

	auto prof = ProfIndexLookup(argument);

	int i;
	auto found = false;
	auto profs_taught_size = std::size(trainer->pIndexData->profs_taught);
	for (i = 0; i < profs_taught_size; i++)
	{
		if (trainer->pIndexData->profs_taught[i] == prof)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		send_to_char("You can't study that here.\n\r", ch);
		return;
	}

	if (ch->Profs()->GetProf(prof) > 0)
	{
		send_to_char("You are already familiar with that proficiency.\n\r", ch);
		return;
	}

	auto proficiency = prof_table[prof];
	if (proficiency.cost > ch->Profs()->GetPoints())
	{
		send_to_char("You don't have enough points to study that proficiency.\n\r", ch);
		return;
	}

	auto prof_requires = ProfIndexLookup(proficiency.requires);
	if (prof_requires != -1 && ch->Profs()->GetProf(prof_requires) < 0)
	{
		send_to_char("That proficiency requires understanding of a proficiency you do not possess.\n\r", ch);
		return;
	}

	if (proficiency.minlevel > ch->level)
	{
		send_to_char("You are not advanced enough in your guild to learn that proficiency.\n\r", ch);
		return;
	}

	act("You ask $N to teach you about $t.", ch, proficiency.name, trainer, TO_CHAR);

	auto messages = prof_msg_table[prof];
	for (i = 0; messages.learning_msgs[i] != nullptr && i < 5; i++)
	{
		if (i == 4 || !messages.learning_msgs[i + 1])
		{
			auto buffer = fmt::format("{}You are now proficient at {}.{}\n\r",
				get_char_color(ch, "yellow"),
				proficiency.name,
				END_COLOR(ch));

			RS.Queue.AddToQueue((i + 1) * 2, "TrainProficiency", "send_to_char_queue", send_to_char_queue, buffer, ch);
		}

		auto message = std::string(prof_msg_table[prof].learning_msgs[i]);
		RS.Queue.AddToQueue((i + 1) * 2, "TrainProficiency", "act_queue", act_queue, message, ch, nullptr, trainer, TO_CHAR);
	}

	ch->Profs()->DeductPoints(proficiency.cost);
	ch->Profs()->SetProf(prof, 1);

	WAIT_STATE(ch, (i + 1) * 2);
}